

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_bench.cc
# Opt level: O0

void randomize_size_classes(void)

{
  undefined4 local_c;
  int i;
  
  randomize_one_size_class(8);
  for (local_c = 0x10; local_c < 0x100; local_c = local_c + 0x10) {
    randomize_one_size_class((long)local_c);
  }
  for (; local_c < 0x200; local_c = local_c + 0x20) {
    randomize_one_size_class((long)local_c);
  }
  for (; local_c < 0x400; local_c = local_c + 0x40) {
    randomize_one_size_class((long)local_c);
  }
  for (; local_c < 0x1000; local_c = local_c + 0x80) {
    randomize_one_size_class((long)local_c);
  }
  for (; local_c < 0x8000; local_c = local_c + 0x400) {
    randomize_one_size_class((long)local_c);
  }
  return;
}

Assistant:

void randomize_size_classes() {
  randomize_one_size_class(8);
  int i;
  for (i = 16; i < 256; i += 16) {
    randomize_one_size_class(i);
  }
  for (; i < 512; i += 32) {
    randomize_one_size_class(i);
  }
  for (; i < 1024; i += 64) {
    randomize_one_size_class(i);
  }
  for (; i < (4 << 10); i += 128) {
    randomize_one_size_class(i);
  }
  for (; i < (32 << 10); i += 1024) {
    randomize_one_size_class(i);
  }
}